

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_full_reduce(uint32_t *x)

{
  uint32_t uVar1;
  uint32_t positive_mask;
  uint32_t negative_mask;
  size_t i;
  uint32_t xsub [17];
  uint32_t *x_local;
  
  for (_positive_mask = 0; _positive_mask < 0x11; _positive_mask = _positive_mask + 1) {
    xsub[_positive_mask - 2] = x[_positive_mask];
  }
  unique0x100000bc = x;
  poly1305_add((uint32_t *)&i,negative_1305);
  uVar1 = mask_u32(xsub[0xe] & 0x80,0x80);
  for (_positive_mask = 0; _positive_mask < 0x11; _positive_mask = _positive_mask + 1) {
    stack0xfffffffffffffff0[_positive_mask] =
         stack0xfffffffffffffff0[_positive_mask] & uVar1 |
         xsub[_positive_mask - 2] & (uVar1 ^ 0xffffffff);
  }
  return;
}

Assistant:

static void poly1305_full_reduce(uint32_t x[17])
{
  uint32_t xsub[17];
  size_t i;

  for (i = 0; i < 17; i++)
    xsub[i] = x[i];

  poly1305_add(xsub, negative_1305);

  /* If x - (2 ** 130 - 5) is negative, then
   * x didn't need reduction: we discard the results.
   * Do this in a side-channel silent way. */
  uint32_t negative_mask = mask_u32(xsub[16] & 0x80, 0x80);
  uint32_t positive_mask = negative_mask ^ 0xffffffff;

  for (i = 0; i < 17; i++)
    x[i] = (x[i] & negative_mask) | (xsub[i] & positive_mask);
}